

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  uint64_t uVar174;
  uint64_t uVar175;
  uint64_t uVar176;
  int iVar177;
  ulong uVar178;
  ulong uVar179;
  ulong uVar180;
  ulong uVar181;
  ulong uVar182;
  secp256k1_gej *psVar183;
  secp256k1_gej *psVar184;
  secp256k1_gej *r_00;
  ulong uVar185;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar186;
  secp256k1_gej *psVar187;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar188;
  secp256k1_gej *psVar189;
  long lVar190;
  secp256k1_gej *unaff_R15;
  secp256k1_gej *a_00;
  uint64_t tmp3_2;
  uint64_t tmp2_2;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe s2;
  uint64_t tmp3_3;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_ge sStack_468;
  secp256k1_ge sStack_400;
  secp256k1_gej sStack_398;
  secp256k1_gej *psStack_300;
  secp256k1_gej *psStack_2f8;
  secp256k1_gej *psStack_2f0;
  secp256k1_gej *psStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *local_2d0;
  secp256k1_gej *local_2c8;
  ulong local_2c0;
  secp256k1_gej *local_2b8;
  secp256k1_fe *local_2b0;
  secp256k1_gej *local_2a8;
  secp256k1_gej *local_2a0;
  secp256k1_gej *local_298;
  ulong local_290;
  secp256k1_gej *local_288;
  secp256k1_gej *local_280;
  secp256k1_gej *local_278;
  secp256k1_gej *local_270;
  secp256k1_gej *local_268;
  secp256k1_gej *local_260;
  undefined1 local_258 [56];
  uint64_t local_220;
  uint64_t local_218;
  uint64_t local_210;
  uint64_t local_208;
  uint local_200;
  undefined1 local_1f8 [56];
  uint64_t local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  int local_1a0;
  undefined1 local_198 [56];
  uint64_t uStack_160;
  uint64_t local_158;
  uint64_t uStack_150;
  uint64_t local_148;
  int local_140;
  int local_13c;
  ulong local_130;
  undefined1 local_128 [56];
  secp256k1_gej *local_f0;
  secp256k1_gej *local_e8;
  secp256k1_gej *local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined1 local_c8 [64];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  
  psStack_2e0 = (secp256k1_gej *)0x123dd3;
  psVar184 = a;
  secp256k1_gej_verify(a);
  psStack_2e0 = (secp256k1_gej *)0x123ddb;
  secp256k1_gej_verify(b);
  psVar183 = b;
  if ((a->infinity != 0) || (psVar183 = a, b->infinity != 0)) {
    memcpy(r,psVar183,0x98);
    return;
  }
  psVar183 = (secp256k1_gej *)&b->z;
  psStack_2e0 = (secp256k1_gej *)0x123e32;
  r_00 = psVar183;
  local_2d0 = r;
  local_2c8 = a;
  secp256k1_fe_verify((secp256k1_fe *)psVar183);
  if ((b->z).magnitude < 9) {
    uVar181 = ((secp256k1_fe *)psVar183)->n[0];
    uVar185 = (b->z).n[1];
    unaff_R12 = (secp256k1_gej *)(b->z).n[2];
    unaff_R13 = (secp256k1_gej *)(b->z).n[3];
    uVar179 = (b->z).n[4];
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar181 * 2;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = unaff_R13;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar185 * 2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = unaff_R12;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar179;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar179;
    uVar178 = SUB168(auVar4 * auVar84,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar83 + auVar2 * auVar82 + auVar5 * ZEXT816(0x1000003d10);
    uVar180 = auVar2._0_8_;
    local_c8._56_8_ = uVar180 & 0xfffffffffffff;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar180 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar179 = uVar179 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar181;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar179;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar185 * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = unaff_R13;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = unaff_R12;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = unaff_R12;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar178 >> 0x34 | SUB168(auVar4 * auVar84,8) << 0xc;
    auVar2 = auVar6 * auVar85 + auVar146 + auVar7 * auVar86 + auVar8 * auVar87 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    local_1f8._0_8_ = (uVar178 & 0xfffffffffffff) >> 0x30;
    psVar184 = (secp256k1_gej *)(uVar178 & 0xffffffffffff);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar181;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar181;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar185;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar179;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (long)unaff_R12 * 2;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = unaff_R13;
    auVar2 = auVar11 * auVar89 + auVar147 + auVar12 * auVar90;
    uVar178 = auVar2._0_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | local_1f8._0_8_;
    auVar2 = auVar10 * auVar88 + ZEXT816(0x1000003d1) * auVar91;
    uVar178 = auVar2._0_8_;
    local_60.n[0] = uVar178 & 0xfffffffffffff;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar181 * 2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar185;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = unaff_R12;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar179;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = unaff_R13;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = unaff_R13;
    auVar3 = auVar14 * auVar93 + auVar149 + auVar15 * auVar94;
    uVar178 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar92 + auVar148 + auVar16 * ZEXT816(0x1000003d10);
    uVar180 = auVar2._0_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar178 >> 0x34 | auVar3._8_8_ << 0xc;
    local_60.n[1] = uVar180 & 0xfffffffffffff;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar180 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar181 * 2;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = unaff_R12;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar185;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar185;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = unaff_R13;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar179;
    auVar151 = auVar19 * auVar97 + auVar151;
    uVar181 = auVar151._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar95 + auVar150 + auVar18 * auVar96 + auVar20 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    local_60.n[2] = uVar185 & 0xfffffffffffff;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = (uVar185 >> 0x34 | auVar2._8_8_ << 0xc) + local_c8._56_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar181 >> 0x34 | auVar151._8_8_ << 0xc;
    auVar152 = auVar21 * ZEXT816(0x1000003d10) + auVar152;
    uVar181 = auVar152._0_8_;
    local_60.n[3] = uVar181 & 0xfffffffffffff;
    local_60.n[4] = (long)(psVar184->x).n + (uVar181 >> 0x34 | auVar152._8_8_ << 0xc);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    psStack_2e0 = (secp256k1_gej *)0x124093;
    local_2b0 = (secp256k1_fe *)psVar183;
    local_1f8._48_8_ = psVar184;
    secp256k1_fe_verify(&local_60);
    a = local_2c8;
    psVar183 = (secp256k1_gej *)&local_2c8->z;
    psStack_2e0 = (secp256k1_gej *)0x1240a4;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    if (8 < (a->z).magnitude) goto LAB_00124f4e;
    unaff_R12 = (secp256k1_gej *)(local_c8 + 0x38);
    uVar181 = ((secp256k1_fe *)psVar183)->n[0];
    uVar185 = (a->z).n[1];
    uVar179 = (a->z).n[2];
    unaff_R13 = (secp256k1_gej *)(a->z).n[3];
    uVar178 = (a->z).n[4];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar181 * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = unaff_R13;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar185 * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar179;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar178;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar178;
    uVar180 = SUB168(auVar24 * auVar100,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar180 & 0xfffffffffffff;
    auVar2 = auVar23 * auVar99 + auVar22 * auVar98 + auVar25 * ZEXT816(0x1000003d10);
    uVar182 = auVar2._0_8_;
    local_1f8._48_8_ = uVar182 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar178 = uVar178 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar181;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar178;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar185 * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = unaff_R13;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar179;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar179;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar180 >> 0x34 | SUB168(auVar24 * auVar100,8) << 0xc;
    auVar2 = auVar26 * auVar101 + auVar153 + auVar27 * auVar102 + auVar28 * auVar103 +
             auVar29 * ZEXT816(0x1000003d10);
    local_1f8._0_8_ = auVar2._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = (ulong)local_1f8._0_8_ >> 0x34 | auVar2._8_8_ << 0xc;
    local_258._48_8_ = (local_1f8._0_8_ & 0xfffffffffffff) >> 0x30;
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffffffff;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar181;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar181;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar185;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar178;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar179 * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = unaff_R13;
    auVar2 = auVar31 * auVar105 + auVar154 + auVar32 * auVar106;
    uVar180 = auVar2._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar180 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (uVar180 & 0xfffffffffffff) << 4 | local_258._48_8_;
    auVar2 = auVar30 * auVar104 + ZEXT816(0x1000003d1) * auVar107;
    uVar180 = auVar2._0_8_;
    local_c8._56_8_ = uVar180 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar180 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar181 * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar185;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar179;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar178;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = unaff_R13;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = unaff_R13;
    auVar3 = auVar34 * auVar109 + auVar156 + auVar35 * auVar110;
    uVar180 = auVar3._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar180 & 0xfffffffffffff;
    auVar2 = auVar33 * auVar108 + auVar155 + auVar36 * ZEXT816(0x1000003d10);
    uVar182 = auVar2._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar180 >> 0x34 | auVar3._8_8_ << 0xc;
    local_88 = uVar182 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar181 * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar179;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar185;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar185;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = unaff_R13;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar178;
    auVar158 = auVar39 * auVar113 + auVar158;
    uVar181 = auVar158._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar37 * auVar111 + auVar157 + auVar38 * auVar112 + auVar40 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    local_80 = uVar185 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ =
         (long)(((secp256k1_gej *)local_1f8._48_8_)->x).n + (uVar185 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar181 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar159 = auVar41 * ZEXT816(0x1000003d10) + auVar159;
    uVar181 = auVar159._0_8_;
    local_78 = uVar181 & 0xfffffffffffff;
    local_70 = (uVar181 >> 0x34 | auVar159._8_8_ << 0xc) + local_1f8._0_8_;
    local_68 = 1;
    psStack_2e0 = (secp256k1_gej *)0x124309;
    local_2b8 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    psVar184 = local_2c8;
    psVar183 = (secp256k1_gej *)(local_1f8 + 0x30);
    psStack_2e0 = (secp256k1_gej *)0x12432c;
    secp256k1_fe_mul((secp256k1_fe *)psVar183,&local_2c8->x,&local_60);
    psStack_2e0 = (secp256k1_gej *)0x12433f;
    secp256k1_fe_mul((secp256k1_fe *)local_1f8,&b->x,(secp256k1_fe *)unaff_R12);
    unaff_R15 = (secp256k1_gej *)(local_258 + 0x30);
    psStack_2e0 = (secp256k1_gej *)0x124356;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R15,&psVar184->y,&local_60);
    psStack_2e0 = (secp256k1_gej *)0x124366;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R15,(secp256k1_fe *)unaff_R15,local_2b0);
    a = (secp256k1_gej *)local_198;
    psStack_2e0 = (secp256k1_gej *)0x124380;
    secp256k1_fe_mul((secp256k1_fe *)a,&b->y,(secp256k1_fe *)unaff_R12);
    psStack_2e0 = (secp256k1_gej *)0x124390;
    psVar184 = a;
    secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,&local_2b8->x);
    psStack_2e0 = (secp256k1_gej *)0x124398;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    if (1 < local_1a0) goto LAB_00124f53;
    unaff_R15 = (secp256k1_gej *)(0x3ffffbfffff0bc - local_1f8._48_8_);
    unaff_R12 = (secp256k1_gej *)(0x3ffffffffffffc - local_1c0);
    unaff_R13 = (secp256k1_gej *)(0x3ffffffffffffc - local_1b8);
    a = (secp256k1_gej *)(0x3ffffffffffffc - local_1b0);
    local_d0 = 2;
    psStack_2e0 = (secp256k1_gej *)0x124419;
    local_128._48_8_ = unaff_R15;
    local_f0 = unaff_R12;
    local_e8 = unaff_R13;
    local_e0 = a;
    local_d8 = 0x3fffffffffffc - local_1a8;
    secp256k1_fe_verify((secp256k1_fe *)(local_128 + 0x30));
    psStack_2e0 = (secp256k1_gej *)0x124421;
    secp256k1_fe_verify((secp256k1_fe *)(local_128 + 0x30));
    psVar183 = (secp256k1_gej *)local_1f8;
    psStack_2e0 = (secp256k1_gej *)0x124431;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    if (0x1e < (int)local_1f8._40_4_) goto LAB_00124f58;
    unaff_R15 = (secp256k1_gej *)((long)(unaff_R15->x).n + local_1f8._0_8_);
    unaff_R12 = (secp256k1_gej *)((long)(unaff_R12->x).n + local_1f8._8_8_);
    unaff_R13 = (secp256k1_gej *)((long)(unaff_R13->x).n + local_1f8._16_8_);
    a = (secp256k1_gej *)((long)(a->x).n + local_1f8._24_8_);
    local_2c0 = (0x3fffffffffffc - local_1a8) + local_1f8._32_8_;
    local_d0 = (ulong)(local_1f8._40_4_ + 2);
    psStack_2e0 = (secp256k1_gej *)0x1244ab;
    local_288 = unaff_R13;
    local_280 = a;
    local_278 = unaff_R15;
    local_270 = unaff_R12;
    local_128._48_8_ = unaff_R15;
    local_f0 = unaff_R12;
    local_e8 = unaff_R13;
    local_e0 = a;
    local_d8 = local_2c0;
    secp256k1_fe_verify((secp256k1_fe *)(local_128 + 0x30));
    psVar183 = (secp256k1_gej *)local_198;
    psStack_2e0 = (secp256k1_gej *)0x1244bb;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    if (1 < (int)local_198._40_4_) goto LAB_00124f5d;
    a = (secp256k1_gej *)(0x3ffffbfffff0bc - local_198._0_8_);
    unaff_R15 = (secp256k1_gej *)(0x3ffffffffffffc - local_198._8_8_);
    unaff_R12 = (secp256k1_gej *)(0x3ffffffffffffc - local_198._16_8_);
    unaff_R13 = (secp256k1_gej *)(0x3fffffffffffc - local_198._32_8_);
    local_128._40_8_ = 2;
    psStack_2e0 = (secp256k1_gej *)0x12453c;
    local_128._0_8_ = a;
    local_128._8_8_ = unaff_R15;
    local_128._16_8_ = unaff_R12;
    local_128._24_8_ = (secp256k1_gej *)(0x3ffffffffffffc - local_198._24_8_);
    local_128._32_8_ = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)local_128);
    psStack_2e0 = (secp256k1_gej *)0x124544;
    secp256k1_fe_verify((secp256k1_fe *)local_128);
    psVar183 = (secp256k1_gej *)(local_258 + 0x30);
    psStack_2e0 = (secp256k1_gej *)0x124554;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    if (0x1e < (int)local_200) goto LAB_00124f62;
    local_298 = (secp256k1_gej *)((long)(a->x).n + local_258._48_8_);
    local_2a0 = (secp256k1_gej *)((long)(unaff_R15->x).n + local_220);
    unaff_R12 = (secp256k1_gej *)((long)(unaff_R12->x).n + local_218);
    psVar184 = (secp256k1_gej *)
               ((long)(((secp256k1_gej *)(0x3ffffffffffffc - local_198._24_8_))->x).n + local_210);
    unaff_R13 = (secp256k1_gej *)((long)(unaff_R13->x).n + local_208);
    local_128._44_4_ = 0;
    local_128._40_4_ = local_200 + 2;
    psStack_2e0 = (secp256k1_gej *)0x1245d3;
    local_2a8 = unaff_R12;
    local_290 = (ulong)local_200;
    local_128._0_8_ = local_298;
    local_128._8_8_ = local_2a0;
    local_128._16_8_ = unaff_R12;
    local_128._24_8_ = psVar184;
    local_128._32_8_ = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)local_128);
    psStack_2e0 = (secp256k1_gej *)0x1245e0;
    secp256k1_fe_verify((secp256k1_fe *)(local_128 + 0x30));
    unaff_R15 = local_2d0;
    uVar181 = (local_2c0 >> 0x30) * 0x1000003d1 + (long)local_278;
    if (((uVar181 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar181 & 0xfffffffffffff) == 0)) {
      uVar180 = (long)(local_270->x).n + (uVar181 >> 0x34);
      uVar185 = (long)(local_288->x).n + (uVar180 >> 0x34);
      uVar179 = (long)(local_280->x).n + (uVar185 >> 0x34);
      uVar178 = (uVar179 >> 0x34) + (local_2c0 & 0xffffffffffff);
      if ((((uVar180 | uVar181 | uVar185 | uVar179) & 0xfffffffffffff) == 0 && uVar178 == 0) ||
         (((uVar181 | 0x1000003d0) & uVar180 & uVar185 & uVar179 & (uVar178 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_2e0 = (secp256k1_gej *)0x124e86;
        secp256k1_fe_verify((secp256k1_fe *)local_128);
        uVar181 = ((ulong)unaff_R13 >> 0x30) * 0x1000003d1 + (long)local_298;
        if (((uVar181 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar181 & 0xfffffffffffff) == 0))
        {
          uVar180 = (long)(local_2a0->x).n + (uVar181 >> 0x34);
          uVar185 = (long)(local_2a8->x).n + (uVar180 >> 0x34);
          uVar179 = (long)(psVar184->x).n + (uVar185 >> 0x34);
          uVar178 = (uVar179 >> 0x34) + ((ulong)unaff_R13 & 0xffffffffffff);
          if ((((uVar180 | uVar181 | uVar185 | uVar179) & 0xfffffffffffff) == 0 && uVar178 == 0) ||
             (((uVar181 | 0x1000003d0) & uVar180 & uVar185 & uVar179 & (uVar178 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            psStack_2e0 = (secp256k1_gej *)0x124f37;
            secp256k1_gej_double_var(local_2d0,local_2c8,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_2e0 = (secp256k1_gej *)0x124f24;
        secp256k1_gej_set_infinity(local_2d0);
        return;
      }
    }
    local_2d0->infinity = 0;
    a = (secp256k1_gej *)(local_198 + 0x30);
    psVar183 = (secp256k1_gej *)(local_128 + 0x30);
    psStack_2e0 = (secp256k1_gej *)0x1246cf;
    secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)psVar183,local_2b0);
    psStack_2e0 = (secp256k1_gej *)0x1246e0;
    psVar184 = local_2b8;
    secp256k1_fe_mul(&unaff_R15->z,&local_2b8->x,(secp256k1_fe *)a);
    psStack_2e0 = (secp256k1_gej *)0x1246e8;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    psVar188 = local_e0;
    psVar186 = local_e8;
    if (8 < (int)local_d0) goto LAB_00124f67;
    r_00 = (secp256k1_gej *)local_c8;
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_128._48_8_ * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_e0;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (long)local_f0 * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_e8;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_d8;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_d8;
    uVar181 = SUB168(auVar44 * auVar116,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar43 * auVar115 + auVar42 * auVar114 + auVar45 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    local_258._0_8_ = uVar185 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    a = (secp256k1_gej *)(local_d8 * 2);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_128._48_8_;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = a;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = (long)local_f0 * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_e0;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_e8;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_e8;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar181 >> 0x34 | SUB168(auVar44 * auVar116,8) << 0xc;
    auVar2 = auVar46 * auVar117 + auVar160 + auVar47 * auVar118 + auVar48 * auVar119 +
             auVar49 * ZEXT816(0x1000003d10);
    uVar181 = auVar2._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    local_268 = (secp256k1_gej *)((uVar181 & 0xfffffffffffff) >> 0x30);
    psVar184 = (secp256k1_gej *)(uVar181 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_128._48_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = local_128._48_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_f0;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = a;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = (long)local_e8 * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_e0;
    auVar2 = auVar51 * auVar121 + auVar161 + auVar52 * auVar122;
    uVar181 = auVar2._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | (ulong)local_268;
    auVar2 = auVar50 * auVar120 + ZEXT816(0x1000003d1) * auVar123;
    uVar181 = auVar2._0_8_;
    local_c8._0_8_ = uVar181 & 0xfffffffffffff;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_128._48_8_ * 2;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_f0;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_e8;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = a;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_e0;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = local_e0;
    auVar3 = auVar54 * auVar125 + auVar163 + auVar55 * auVar126;
    uVar181 = auVar3._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar53 * auVar124 + auVar162 + auVar56 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar181 >> 0x34 | auVar3._8_8_ << 0xc;
    local_c8._8_8_ = uVar185 & 0xfffffffffffff;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_128._48_8_ * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_e8;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_f0;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = local_f0;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_e0;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = a;
    auVar165 = auVar59 * auVar129 + auVar165;
    uVar181 = auVar165._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar57 * auVar127 + auVar164 + auVar58 * auVar128 + auVar60 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    psVar183 = (secp256k1_gej *)(uVar181 >> 0x34 | auVar165._8_8_ << 0xc);
    local_c8._16_8_ = uVar185 & 0xfffffffffffff;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (uVar185 >> 0x34 | auVar2._8_8_ << 0xc) + local_258._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = psVar183;
    auVar166 = auVar61 * ZEXT816(0x1000003d10) + auVar166;
    uVar181 = auVar166._0_8_;
    local_c8._24_8_ = uVar181 & 0xfffffffffffff;
    local_c8._32_8_ = (long)(psVar184->x).n + (uVar181 >> 0x34 | auVar166._8_8_ << 0xc);
    local_c8._40_4_ = 1;
    local_c8._44_4_ = 0;
    psStack_2e0 = (secp256k1_gej *)0x124938;
    local_260 = psVar184;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_2e0 = (secp256k1_gej *)0x124940;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (1 < (int)local_c8._40_4_) goto LAB_00124f6c;
    local_c8._0_8_ = 0x3ffffbfffff0bc - local_c8._0_8_;
    local_c8._8_8_ = 0x3ffffffffffffc - local_c8._8_8_;
    local_c8._16_8_ = 0x3ffffffffffffc - local_c8._16_8_;
    local_c8._24_8_ = 0x3ffffffffffffc - local_c8._24_8_;
    local_c8._32_8_ = 0x3fffffffffffc - local_c8._32_8_;
    local_c8._40_4_ = 2;
    local_c8._44_4_ = 0;
    psStack_2e0 = (secp256k1_gej *)0x124996;
    secp256k1_fe_verify((secp256k1_fe *)local_c8);
    psStack_2e0 = (secp256k1_gej *)0x1249ae;
    secp256k1_fe_mul((secp256k1_fe *)local_258,(secp256k1_fe *)local_c8,
                     (secp256k1_fe *)(local_128 + 0x30));
    psVar184 = (secp256k1_gej *)(local_1f8 + 0x30);
    psStack_2e0 = (secp256k1_gej *)0x1249c6;
    secp256k1_fe_mul((secp256k1_fe *)(local_198 + 0x30),(secp256k1_fe *)psVar184,
                     (secp256k1_fe *)local_c8);
    psVar183 = (secp256k1_gej *)local_128;
    psStack_2e0 = (secp256k1_gej *)0x1249d6;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    psVar189 = (secp256k1_gej *)local_128._24_8_;
    psVar187 = (secp256k1_gej *)local_128._16_8_;
    a_00 = local_2d0;
    r_00 = local_2d0;
    if (6 < (int)local_290) goto LAB_00124f71;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_128._0_8_ * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = local_128._24_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_128._8_8_ * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = local_128._16_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_128._32_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = local_128._32_8_;
    uVar181 = SUB168(auVar64 * auVar132,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar63 * auVar131 + auVar62 * auVar130 + auVar65 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    local_260 = (secp256k1_gej *)(uVar185 & 0xfffffffffffff);
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    a = (secp256k1_gej *)(local_128._32_8_ * 2);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_128._0_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = a;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_128._8_8_ * 2;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_128._24_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_128._16_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = local_128._16_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar181 >> 0x34 | SUB168(auVar64 * auVar132,8) << 0xc;
    auVar2 = auVar66 * auVar133 + auVar167 + auVar67 * auVar134 + auVar68 * auVar135 +
             auVar69 * ZEXT816(0x1000003d10);
    uVar181 = auVar2._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    local_130 = (uVar181 & 0xfffffffffffff) >> 0x30;
    psVar184 = (secp256k1_gej *)(uVar181 & 0xffffffffffff);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_128._0_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_128._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_128._8_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = a;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_128._16_8_ * 2;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_128._24_8_;
    auVar2 = auVar71 * auVar137 + auVar168 + auVar72 * auVar138;
    uVar181 = auVar2._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | local_130;
    auVar2 = auVar70 * auVar136 + ZEXT816(0x1000003d1) * auVar139;
    uVar181 = auVar2._0_8_;
    (local_2d0->x).n[0] = uVar181 & 0xfffffffffffff;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_128._0_8_ * 2;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = local_128._8_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_128._16_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = a;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_128._24_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = local_128._24_8_;
    auVar3 = auVar74 * auVar141 + auVar170 + auVar75 * auVar142;
    uVar181 = auVar3._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar73 * auVar140 + auVar169 + auVar76 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar181 >> 0x34 | auVar3._8_8_ << 0xc;
    (local_2d0->x).n[1] = uVar185 & 0xfffffffffffff;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_128._0_8_ * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = local_128._16_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_128._8_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = local_128._8_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_128._24_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = a;
    auVar172 = auVar79 * auVar145 + auVar172;
    uVar181 = auVar172._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar77 * auVar143 + auVar171 + auVar78 * auVar144 + auVar80 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    (local_2d0->x).n[2] = uVar185 & 0xfffffffffffff;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (long)(local_260->x).n + (uVar185 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar181 >> 0x34 | auVar172._8_8_ << 0xc;
    auVar173 = auVar81 * ZEXT816(0x1000003d10) + auVar173;
    uVar181 = auVar173._0_8_;
    (local_2d0->x).n[3] = uVar181 & 0xfffffffffffff;
    (local_2d0->x).n[4] = (long)(psVar184->x).n + (uVar181 >> 0x34 | auVar173._8_8_ << 0xc);
    (local_2d0->x).magnitude = 1;
    (local_2d0->x).normalized = 0;
    psStack_2e0 = (secp256k1_gej *)0x124c29;
    local_268 = psVar184;
    secp256k1_fe_verify(&local_2d0->x);
    psStack_2e0 = (secp256k1_gej *)0x124c31;
    secp256k1_fe_verify(&a_00->x);
    psVar183 = (secp256k1_gej *)local_258;
    psStack_2e0 = (secp256k1_gej *)0x124c41;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    iVar177 = local_258._40_4_ + (a_00->x).magnitude;
    if (0x20 < iVar177) goto LAB_00124f76;
    uVar174 = (a_00->x).n[1];
    uVar175 = (a_00->x).n[2];
    uVar176 = (a_00->x).n[3];
    (a_00->x).n[0] = (a_00->x).n[0] + local_258._0_8_;
    (a_00->x).n[1] = uVar174 + local_258._8_8_;
    (a_00->x).n[2] = uVar175 + local_258._16_8_;
    (a_00->x).n[3] = uVar176 + local_258._24_8_;
    puVar1 = (a_00->x).n + 4;
    *puVar1 = *puVar1 + local_258._32_8_;
    (a_00->x).magnitude = iVar177;
    (a_00->x).normalized = 0;
    psStack_2e0 = (secp256k1_gej *)0x124c99;
    secp256k1_fe_verify(&a_00->x);
    psStack_2e0 = (secp256k1_gej *)0x124ca1;
    secp256k1_fe_verify(&a_00->x);
    psVar183 = (secp256k1_gej *)(local_198 + 0x30);
    psStack_2e0 = (secp256k1_gej *)0x124cb1;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    iVar177 = local_140 + (a_00->x).magnitude;
    if (0x20 < iVar177) goto LAB_00124f7b;
    uVar174 = (a_00->x).n[1];
    uVar175 = (a_00->x).n[2];
    uVar176 = (a_00->x).n[3];
    psVar183 = (secp256k1_gej *)(local_198 + 0x30);
    (a_00->x).n[0] = (a_00->x).n[0] + local_198._48_8_;
    (a_00->x).n[1] = uVar174 + uStack_160;
    (a_00->x).n[2] = uVar175 + local_158;
    (a_00->x).n[3] = uVar176 + uStack_150;
    puVar1 = (a_00->x).n + 4;
    *puVar1 = *puVar1 + local_148;
    (a_00->x).magnitude = iVar177;
    (a_00->x).normalized = 0;
    psStack_2e0 = (secp256k1_gej *)0x124d04;
    secp256k1_fe_verify(&a_00->x);
    psStack_2e0 = (secp256k1_gej *)0x124d0c;
    secp256k1_fe_verify(&a_00->x);
    psStack_2e0 = (secp256k1_gej *)0x124d14;
    r_00 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    iVar177 = local_140 + (a_00->x).magnitude;
    if (0x20 < iVar177) goto LAB_00124f80;
    uVar174 = (a_00->x).n[1];
    uVar175 = (a_00->x).n[2];
    uVar176 = (a_00->x).n[3];
    psVar183 = (secp256k1_gej *)(local_198 + 0x30);
    (a_00->x).n[0] = (a_00->x).n[0] + local_198._48_8_;
    (a_00->x).n[1] = uVar174 + uStack_160;
    (a_00->x).n[2] = uVar175 + local_158;
    (a_00->x).n[3] = uVar176 + uStack_150;
    puVar1 = (a_00->x).n + 4;
    *puVar1 = *puVar1 + local_148;
    (a_00->x).magnitude = iVar177;
    (a_00->x).normalized = 0;
    psStack_2e0 = (secp256k1_gej *)0x124d67;
    secp256k1_fe_verify(&a_00->x);
    psStack_2e0 = (secp256k1_gej *)0x124d6f;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    psStack_2e0 = (secp256k1_gej *)0x124d77;
    r_00 = a_00;
    secp256k1_fe_verify(&a_00->x);
    iVar177 = (a_00->x).magnitude + local_140;
    if (iVar177 < 0x21) {
      local_198._48_8_ = (a_00->x).n[0] + local_198._48_8_;
      uStack_160 = (a_00->x).n[1] + uStack_160;
      local_158 = (a_00->x).n[2] + local_158;
      uStack_150 = (a_00->x).n[3] + uStack_150;
      local_148 = local_148 + (a_00->x).n[4];
      local_13c = 0;
      psStack_2e0 = (secp256k1_gej *)0x124dcc;
      local_140 = iVar177;
      secp256k1_fe_verify((secp256k1_fe *)(local_198 + 0x30));
      psVar183 = (secp256k1_gej *)&a_00->y;
      psStack_2e0 = (secp256k1_gej *)0x124de3;
      secp256k1_fe_mul((secp256k1_fe *)psVar183,(secp256k1_fe *)(local_198 + 0x30),
                       (secp256k1_fe *)local_128);
      a = (secp256k1_gej *)local_258;
      psStack_2e0 = (secp256k1_gej *)0x124dfe;
      psVar184 = a;
      secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,(secp256k1_fe *)(local_258 + 0x30));
      psStack_2e0 = (secp256k1_gej *)0x124e06;
      secp256k1_fe_verify((secp256k1_fe *)psVar183);
      psStack_2e0 = (secp256k1_gej *)0x124e0e;
      r_00 = a;
      secp256k1_fe_verify((secp256k1_fe *)a);
      iVar177 = local_258._40_4_ + (a_00->y).magnitude;
      if (iVar177 < 0x21) {
        uVar174 = (a_00->y).n[1];
        uVar175 = (a_00->y).n[2];
        uVar176 = (a_00->y).n[3];
        (a_00->y).n[0] = (a_00->y).n[0] + local_258._0_8_;
        (a_00->y).n[1] = uVar174 + local_258._8_8_;
        (a_00->y).n[2] = uVar175 + local_258._16_8_;
        (a_00->y).n[3] = uVar176 + local_258._24_8_;
        puVar1 = (a_00->y).n + 4;
        *puVar1 = *puVar1 + local_258._32_8_;
        (a_00->y).magnitude = iVar177;
        (a_00->y).normalized = 0;
        psStack_2e0 = (secp256k1_gej *)0x124e69;
        secp256k1_fe_verify((secp256k1_fe *)psVar183);
        psStack_2e0 = (secp256k1_gej *)0x124e71;
        secp256k1_gej_verify(a_00);
        return;
      }
      goto LAB_00124f8a;
    }
  }
  else {
    psStack_2e0 = (secp256k1_gej *)0x124f4e;
    secp256k1_gej_add_var_cold_14();
LAB_00124f4e:
    psStack_2e0 = (secp256k1_gej *)0x124f53;
    secp256k1_gej_add_var_cold_13();
LAB_00124f53:
    psStack_2e0 = (secp256k1_gej *)0x124f58;
    secp256k1_gej_add_var_cold_12();
LAB_00124f58:
    psStack_2e0 = (secp256k1_gej *)0x124f5d;
    secp256k1_gej_add_var_cold_11();
LAB_00124f5d:
    psStack_2e0 = (secp256k1_gej *)0x124f62;
    secp256k1_gej_add_var_cold_10();
LAB_00124f62:
    psStack_2e0 = (secp256k1_gej *)0x124f67;
    secp256k1_gej_add_var_cold_9();
LAB_00124f67:
    psVar188 = unaff_R13;
    psVar186 = unaff_R12;
    psStack_2e0 = (secp256k1_gej *)0x124f6c;
    secp256k1_gej_add_var_cold_8();
LAB_00124f6c:
    psStack_2e0 = (secp256k1_gej *)0x124f71;
    secp256k1_gej_add_var_cold_7();
LAB_00124f71:
    a_00 = unaff_R15;
    psVar189 = psVar188;
    psVar187 = psVar186;
    psStack_2e0 = (secp256k1_gej *)0x124f76;
    secp256k1_gej_add_var_cold_6();
LAB_00124f76:
    psStack_2e0 = (secp256k1_gej *)0x124f7b;
    secp256k1_gej_add_var_cold_5();
LAB_00124f7b:
    psStack_2e0 = (secp256k1_gej *)0x124f80;
    secp256k1_gej_add_var_cold_4();
LAB_00124f80:
    psStack_2e0 = (secp256k1_gej *)0x124f85;
    secp256k1_gej_add_var_cold_3();
  }
  psStack_2e0 = (secp256k1_gej *)0x124f8a;
  secp256k1_gej_add_var_cold_2();
LAB_00124f8a:
  psStack_2e0 = (secp256k1_gej *)secp256k1_ecmult_compute_table;
  secp256k1_gej_add_var_cold_1();
  psStack_300 = psVar183;
  psStack_2f8 = psVar187;
  psStack_2f0 = psVar189;
  psStack_2e8 = a;
  psStack_2e0 = a_00;
  memcpy(&sStack_398,psVar184,0x98);
  secp256k1_ge_set_gej_var(&sStack_400,&sStack_398);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)r_00,&sStack_400);
  secp256k1_gej_double_var(&sStack_398,psVar184,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&sStack_468,&sStack_398);
  lVar190 = 0x40;
  do {
    secp256k1_gej_set_ge(&sStack_398,&sStack_400);
    secp256k1_gej_add_ge_var(&sStack_398,&sStack_398,&sStack_468,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&sStack_400,&sStack_398);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(r_00->x).n + lVar190),&sStack_400);
    lVar190 = lVar190 + 0x40;
  } while (lVar190 != 0x100);
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;

    secp256k1_gej_verify(a);
    secp256k1_gej_verify(b);
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);
    secp256k1_gej_verify(r);
}